

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O2

void xxHash64_test(void *key,int len,uint32_t seed,void *out)

{
  long *plVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  uint *puVar5;
  ulong uVar6;
  ulong uVar7;
  long *plVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar11 = (ulong)seed;
  if ((uint)len < 0x20) {
    lVar4 = uVar11 + 0x27d4eb2f165667c5;
  }
  else {
    plVar8 = (long *)((long)key + (long)len + -0x20);
    uVar6 = uVar11 + 0xc2b2ae3d27d4eb4f;
    uVar9 = uVar11 + 0x60ea27eeadc0b5d6;
    uVar13 = uVar11 + 0x61c8864e7a143579;
    do {
      uVar11 = *(long *)((long)key + 0x10) * -0x3d4d51c2d82b14b1 + uVar11;
      uVar9 = *key * -0x3d4d51c2d82b14b1 + uVar9;
      uVar6 = *(long *)((long)key + 8) * -0x3d4d51c2d82b14b1 + uVar6;
      uVar10 = uVar11 >> 0x21 | uVar11 * 0x80000000;
      plVar1 = (long *)((long)key + 0x18);
      uVar3 = uVar9 >> 0x21 | uVar9 * 0x80000000;
      uVar7 = uVar6 >> 0x21 | uVar6 * 0x80000000;
      key = (void *)((long)key + 0x20);
      uVar9 = uVar3 * -0x61c8864e7a143579;
      uVar6 = uVar7 * -0x61c8864e7a143579;
      uVar11 = uVar10 * -0x61c8864e7a143579;
      uVar13 = *plVar1 * -0x3d4d51c2d82b14b1 + uVar13;
      uVar12 = uVar13 >> 0x21 | uVar13 * 0x80000000;
      uVar13 = uVar12 * -0x61c8864e7a143579;
    } while (key <= plVar8);
    lVar4 = ((uVar12 * -0x210ca4fef0869357 >> 0x21 | uVar12 * -0x784349ab80000000) *
             -0x61c8864e7a143579 ^
            ((uVar10 * -0x210ca4fef0869357 >> 0x21 | uVar10 * -0x784349ab80000000) *
             -0x61c8864e7a143579 ^
            ((uVar7 * -0x210ca4fef0869357 >> 0x21 | uVar7 * -0x784349ab80000000) *
             -0x61c8864e7a143579 ^
            ((uVar3 * -0x210ca4fef0869357 >> 0x21 | uVar3 * -0x784349ab80000000) *
             -0x61c8864e7a143579 ^
            (uVar13 >> 0x2e | uVar12 * -0x1939e850d5e40000) +
            (uVar11 >> 0x34 | uVar10 * 0x779b185ebca87000) +
            (uVar6 >> 0x39 | uVar7 * 0x1bbcd8c2f5e54380) +
            (uVar9 >> 0x3f | uVar3 * 0x3c6ef3630bd7950e)) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63
            ) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63
            ) * -0x61c8864e7a143579 + -0x7a1435883d4d519d;
  }
  uVar6 = lVar4 + len;
  plVar8 = (long *)key;
  for (uVar11 = (ulong)(len & 0x1f); 7 < uVar11; uVar11 = uVar11 - 8) {
    lVar4 = *plVar8;
    plVar8 = plVar8 + 1;
    uVar6 = ((ulong)(lVar4 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar4 * -0x6c158a5880000000) *
            -0x61c8864e7a143579 ^ uVar6;
    uVar6 = (uVar6 >> 0x25 | uVar6 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  }
  uVar11 = (ulong)(len & 0x1f) - (ulong)(len & 0x18);
  puVar5 = (uint *)((long)key + (ulong)(len & 0x18));
  if (3 < uVar11) {
    uVar2 = *puVar5;
    puVar5 = puVar5 + 1;
    uVar11 = uVar11 - 4;
    uVar6 = (ulong)uVar2 * -0x61c8864e7a143579 ^ uVar6;
    uVar6 = (uVar6 >> 0x29 | uVar6 << 0x17) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
  }
  for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
    uVar6 = (ulong)*(byte *)((long)puVar5 + uVar9) * 0x27d4eb2f165667c5 ^ uVar6;
    uVar6 = (uVar6 >> 0x35 | uVar6 << 0xb) * -0x61c8864e7a143579;
  }
  uVar11 = (uVar6 >> 0x21 ^ uVar6) * -0x3d4d51c2d82b14b1;
  uVar11 = (uVar11 >> 0x1d ^ uVar11) * 0x165667b19e3779f9;
  *(ulong *)out = uVar11 >> 0x20 ^ uVar11;
  return;
}

Assistant:

inline void xxHash64_test( const void * key, int len, uint32_t seed, void * out ) {
  // objsize 630-7fc + c10-1213: 1999
  *(uint64_t*)out = (uint64_t) XXH64(key, (size_t) len, (unsigned long long) seed);
}